

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalNinjaGenerator::ConvertToIncludeReference
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *path,
          OutputFormat format,bool forceFullPaths)

{
  cmOutputConverter *this_00;
  string *psVar1;
  undefined3 in_register_00000081;
  string local_50;
  
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (CONCAT31(in_register_00000081,forceFullPaths) == 0) {
    psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmLocalGenerator::MaybeConvertToRelativePath(&local_50,(cmLocalGenerator *)this,psVar1,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_50,format);
  }
  else {
    cmsys::SystemTools::CollapseFullPath(&local_50,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_50,format);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::ConvertToIncludeReference(
  std::string const& path, cmOutputConverter::OutputFormat format,
  bool forceFullPaths)
{
  if (forceFullPaths) {
    return this->ConvertToOutputFormat(cmSystemTools::CollapseFullPath(path),
                                       format);
  }
  return this->ConvertToOutputFormat(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), path),
    format);
}